

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::AsyncIoStreamWithGuards::write(AsyncIoStreamWithGuards *this,int __fd,void *__buf,size_t __n)

{
  AsyncIoStream *pAVar1;
  undefined4 in_register_00000034;
  Type local_40;
  long local_28;
  AsyncIoStreamWithGuards *this_local;
  ArrayPtr<const_unsigned_char> buffer_local;
  
  local_28 = CONCAT44(in_register_00000034,__fd);
  this_local = (AsyncIoStreamWithGuards *)__buf;
  buffer_local.ptr = (uchar *)__n;
  buffer_local.size_ = (size_t)this;
  if ((*(byte *)(local_28 + 0x49) & 1) == 0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&local_40);
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::write(kj::ArrayPtr<unsigned_char_const>)::_lambda()_1_>
              ((Promise<void> *)this,&local_40);
    Promise<void>::~Promise((Promise<void> *)&local_40);
  }
  else {
    pAVar1 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                       ((Own<kj::AsyncIoStream,_std::nullptr_t> *)(local_28 + 0x18));
    local_40.buffer.ptr = (uchar *)this_local;
    local_40.buffer.size_ = (size_t)buffer_local.ptr;
    (**(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream)
              (this,&pAVar1->super_AsyncOutputStream,this_local,buffer_local.ptr);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    if (writeGuardReleased) {
      return inner->write(buffer);
    } else {
      return writeGuard.addBranch().then([this,buffer]() {
        return inner->write(buffer);
      });
    }
  }